

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O0

void timer_add(timer *T,void *arg,size_t sz,int time)

{
  timer_node *node_00;
  timer_node *node;
  int time_local;
  size_t sz_local;
  void *arg_local;
  timer *T_local;
  
  node_00 = (timer_node *)malloc(sz + 0x10);
  memcpy(node_00 + 1,arg,sz);
  spinlock_lock(&T->lock);
  node_00->expire = time + T->time;
  add_node(T,node_00);
  spinlock_unlock(&T->lock);
  return;
}

Assistant:

static void
timer_add(struct timer *T,void *arg,size_t sz,int time) {
	struct timer_node *node = (struct timer_node *)skynet_malloc(sizeof(*node)+sz);
	memcpy(node+1,arg,sz);

	SPIN_LOCK(T);

		node->expire=time+T->time;
		add_node(T,node);

	SPIN_UNLOCK(T);
}